

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O1

Array<asl::Array<asl::Var>_> __thiscall asl::TabularDataFile::data(TabularDataFile *this)

{
  Var *p;
  bool bVar1;
  TabularDataFile *in_RSI;
  Array<asl::Var> b;
  Array<asl::Var> local_20;
  
  Array<asl::Array<asl::Var>_>::alloc((Array<asl::Array<asl::Var>_> *)this,0);
  while( true ) {
    bVar1 = nextRow(in_RSI);
    if (!bVar1) break;
    p = (in_RSI->_row)._a;
    Array<asl::Var>::Array(&local_20,p,p[-1]._type);
    Array<asl::Array<asl::Var>_>::insert((Array<asl::Array<asl::Var>_> *)this,-1,&local_20);
    Array<asl::Var>::~Array(&local_20);
  }
  return (Array<asl::Array<asl::Var>_>)(Array<asl::Var> *)this;
}

Assistant:

Array<Array<Var> > TabularDataFile::data()
{
	Array<Array<Var> > data;

	while(nextRow())
	{
		data << _row.clone();
	}
	return data;
}